

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O2

uint __thiscall
dg::BBlock<dg::LLVMNode>::removeSuccessorsTarget
          (BBlock<dg::LLVMNode> *this,BBlock<dg::LLVMNode> *target)

{
  _Base_ptr p_Var1;
  uint uVar2;
  BBlockEdge n;
  SuccContainerT tmp;
  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar2 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var1 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(BBlock<dg::LLVMNode> **)(p_Var1 + 1) == target) {
      uVar2 = uVar2 + 1;
    }
    else {
      n._8_4_ = *(undefined4 *)&p_Var1[1]._M_parent;
      n.target = *(BBlock<dg::LLVMNode> **)(p_Var1 + 1);
      n._12_4_ = 0;
      DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::insert
                ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)&local_60,n);
    }
  }
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
  ::swap((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
          *)&this->nextBBs,&local_60);
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
  ::~_Rb_tree(&local_60);
  return uVar2;
}

Assistant:

unsigned removeSuccessorsTarget(BBlock<NodeT> *target) {
        unsigned removed = 0;
        SuccContainerT tmp;
        // approx
        for (auto &edge : nextBBs) {
            if (edge.target != target)
                tmp.insert(edge);
            else
                ++removed;
        }

        nextBBs.swap(tmp);
        return removed;
    }